

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O1

int DoInclude(int dummy)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  char *pcVar8;
  size_t sVar9;
  char *__dest;
  char *pcVar10;
  char *pcVar11;
  
  pcVar10 = Line2;
  if (including == '\x01') {
    Printf("Sorry, can\'t nest includes\n");
  }
  else {
    iVar7 = strncasecmp(Line2,"notext",6);
    pcVar11 = Line2;
    if (((iVar7 == 0) && (pcVar10[6] != '\0')) &&
       (iVar7 = isspace((int)pcVar10[6]), pcVar11 = Line2, iVar7 != 0)) {
      includenotext = 1;
      cVar6 = pcVar10[7];
      pcVar11 = pcVar10 + 7;
      while ((cVar6 != '\0' && (iVar7 = isspace((int)cVar6), iVar7 != 0))) {
        cVar6 = pcVar11[1];
        pcVar11 = pcVar11 + 1;
      }
    }
    Line2 = pcVar11;
    pcVar10 = Line2;
    stripwhite(Line2);
    if (*pcVar10 == '\"') {
      Line2 = pcVar10 + 1;
      for (pcVar10 = Line2; (*pcVar10 != '\0' && (*pcVar10 != '\"')); pcVar10 = pcVar10 + 1) {
      }
      *pcVar10 = '\0';
    }
    pcVar10 = Line2;
    if (*Line2 == '\0') {
      Printf("Include directive is missing filename\n");
    }
    else {
      pcVar8 = (char *)0x0;
      DPrintf(4,"Including %s\n",Line2);
      pcVar4 = PatchPt;
      iVar3 = dversion;
      iVar2 = pversion;
      pcVar1 = PatchFile;
      pcVar11 = PatchName;
      iVar7 = PatchSize;
      including = 1;
      if (PatchName != (char *)0x0) {
        pcVar8 = strrchr(PatchName,0x2f);
      }
      __dest = pcVar10;
      if (pcVar8 != (char *)0x0) {
        sVar9 = strlen(pcVar10);
        __dest = (char *)operator_new__((ulong)(pcVar8 + (sVar9 - (long)pcVar11) + 2));
        strncpy(__dest,pcVar11,(size_t)(pcVar8 + (1 - (long)pcVar11)));
        strcpy(__dest + (long)(pcVar8 + (1 - (long)pcVar11)),pcVar10);
        bVar5 = FileExists(__dest);
        if (!bVar5) {
          operator_delete__(__dest);
          __dest = pcVar10;
        }
      }
      D_LoadDehFile(__dest);
      if (pcVar10 != __dest) {
        operator_delete__(__dest);
      }
      DPrintf(4,"Done with include\n");
      PatchSize = iVar7;
      PatchName = pcVar11;
      PatchFile = pcVar1;
      pversion = iVar2;
      dversion = iVar3;
      PatchPt = pcVar4;
    }
    including = '\0';
    includenotext = 0;
  }
  iVar7 = GetLine();
  return iVar7;
}

Assistant:

static int DoInclude (int dummy)
{
	char *data;
	int savedversion, savepversion, savepatchsize;
	char *savepatchfile, *savepatchpt, *savepatchname;

	if (including)
	{
		Printf ("Sorry, can't nest includes\n");
		return GetLine();
	}

	if (strnicmp (Line2, "notext", 6) == 0 && Line2[6] != 0 && isspace(Line2[6]))
	{
		includenotext = true;
		Line2 = skipwhite (Line2+7);
	}

	stripwhite (Line2);
	if (*Line2 == '\"')
	{
		data = ++Line2;
		while (*data && *data != '\"')
			data++;
		*data = 0;
	}

	if (*Line2 == 0)
	{
		Printf ("Include directive is missing filename\n");
	}
	else
	{
		data = Line2;
		DPrintf (DMSG_SPAMMY, "Including %s\n", data);
		savepatchname = PatchName;
		savepatchfile = PatchFile;
		savepatchpt = PatchPt;
		savepatchsize = PatchSize;
		savedversion = dversion;
		savepversion = pversion;
		including = true;

		// Try looking for the included file in the same directory
		// as the patch before looking in the current file.
		const char *lastSlash = savepatchname ? strrchr (savepatchname, '/') : NULL;
		char *path = data;

		if (lastSlash != NULL)
		{
			size_t pathlen = lastSlash - savepatchname + strlen (data) + 2;
			path = new char[pathlen];
			strncpy (path, savepatchname, (lastSlash - savepatchname) + 1);
			strcpy (path + (lastSlash - savepatchname) + 1, data);
			if (!FileExists (path))
			{
				delete[] path;
				path = data;
			}
		}

		D_LoadDehFile(path);

		if (data != path)
		{
			delete[] path;
		}

		DPrintf (DMSG_SPAMMY, "Done with include\n");
		PatchName = savepatchname;
		PatchFile = savepatchfile;
		PatchPt = savepatchpt;
		PatchSize = savepatchsize;
		dversion = savedversion;
		pversion = savepversion;
	}

	including = false;
	includenotext = false;
	return GetLine();
}